

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdquerymgr.cc
# Opt level: O3

void __thiscall
bdQueryManager::QueryStatus
          (bdQueryManager *this,
          map<bdNodeId,_bdQueryStatus,_std::less<bdNodeId>,_std::allocator<std::pair<const_bdNodeId,_bdQueryStatus>_>_>
          *statusMap)

{
  list<bdId,_std::allocator<bdId>_> *answer;
  bdQuery *this_00;
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  mapped_type *pmVar3;
  _List_node_base *p_Var4;
  bdQueryStatus status;
  mapped_type local_50;
  
  p_Var4 = (this->mLocalQueries).super__List_base<bdQuery_*,_std::allocator<bdQuery_*>_>._M_impl.
           _M_node.super__List_node_base._M_next;
  if (p_Var4 != (_List_node_base *)&this->mLocalQueries) {
    answer = &local_50.mResults;
    do {
      local_50.mResults.super__List_base<bdId,_std::allocator<bdId>_>._M_impl._M_node._M_size = 0;
      this_00 = (bdQuery *)p_Var4[1]._M_next;
      local_50.mStatus = this_00->mState;
      local_50.mQFlags = this_00->mQueryFlags;
      local_50.mResults.super__List_base<bdId,_std::allocator<bdId>_>._M_impl._M_node.
      super__List_node_base._M_next = (_List_node_base *)answer;
      local_50.mResults.super__List_base<bdId,_std::allocator<bdId>_>._M_impl._M_node.
      super__List_node_base._M_prev = (_List_node_base *)answer;
      bdQuery::result(this_00,answer);
      pmVar3 = std::
               map<bdNodeId,_bdQueryStatus,_std::less<bdNodeId>,_std::allocator<std::pair<const_bdNodeId,_bdQueryStatus>_>_>
               ::operator[](statusMap,(key_type *)p_Var4[1]._M_next);
      pmVar3->mStatus = local_50.mStatus;
      pmVar3->mQFlags = local_50.mQFlags;
      p_Var2 = local_50.mResults.super__List_base<bdId,_std::allocator<bdId>_>._M_impl._M_node.
               super__List_node_base._M_next;
      if (pmVar3 != &local_50) {
        std::__cxx11::list<bdId,std::allocator<bdId>>::
        _M_assign_dispatch<std::_List_const_iterator<bdId>>
                  ((list<bdId,std::allocator<bdId>> *)&pmVar3->mResults,
                   local_50.mResults.super__List_base<bdId,_std::allocator<bdId>_>._M_impl._M_node.
                   super__List_node_base._M_next,answer);
        p_Var2 = local_50.mResults.super__List_base<bdId,_std::allocator<bdId>_>._M_impl._M_node.
                 super__List_node_base._M_next;
      }
      while (p_Var2 != (_List_node_base *)answer) {
        p_Var1 = (((_List_base<bdId,_std::allocator<bdId>_> *)&p_Var2->_M_next)->_M_impl)._M_node.
                 super__List_node_base._M_next;
        operator_delete(p_Var2,0x38);
        p_Var2 = p_Var1;
      }
      p_Var4 = p_Var4->_M_next;
    } while (p_Var4 != (_List_node_base *)&this->mLocalQueries);
  }
  return;
}

Assistant:

void bdQueryManager::QueryStatus(std::map<bdNodeId, bdQueryStatus> &statusMap) {
	std::list<bdQuery *>::iterator it;
	for (it = mLocalQueries.begin(); it != mLocalQueries.end(); it++) {
		bdQueryStatus status;
		status.mStatus = (*it)->mState;
		status.mQFlags = (*it)->mQueryFlags;
		(*it)->result(status.mResults);
		statusMap[(*it)->mId] = status;
	}
}